

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O2

void __thiscall jsonnet::internal::anon_unknown_0::Heap::markFrom(Heap *this,HeapEntity *from)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar11;
  HeapEntity *pHVar5;
  pointer ppHVar6;
  undefined1 uVar9;
  undefined6 uVar12;
  undefined6 uVar13;
  _func_int **pp_Var7;
  undefined6 uVar14;
  undefined6 uVar15;
  pointer pSVar16;
  long lVar17;
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  *vec;
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  *extraout_RDX;
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  *vec_00;
  GarbageCollectionMark GVar18;
  _func_int **pp_Var19;
  _Rb_tree_node_base *p_Var20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vector<State,_std::allocator<State>_> stack;
  HeapEntity *next;
  vector<State,_std::allocator<State>_> local_58;
  HeapEntity *local_40;
  HeapEntity *local_38;
  
  local_38 = from;
  if (from == (HeapEntity *)0x0) {
    __assert_fail("from != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h",
                  0x160,
                  "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)");
  }
  GVar18 = this->lastMark;
  local_58.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State,std::allocator<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State>>
  ::emplace_back<jsonnet::internal::(anonymous_namespace)::HeapEntity*&>
            ((vector<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State,std::allocator<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State>>
              *)&local_58,&local_38);
  GVar18 = GVar18 + '\x01';
  do {
    pSVar16 = local_58.super__Vector_base<State,_std::allocator<State>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (local_58.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_58.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      std::vector<State,_std::allocator<State>_>::~vector(&local_58);
      return;
    }
    pHVar5 = local_58.super__Vector_base<State,_std::allocator<State>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].ent;
    if (pHVar5->mark != GVar18) {
      pHVar5->mark = GVar18;
      switch(pHVar5->type) {
      case THUNK:
        auVar24 = __dynamic_cast(pHVar5,&(anonymous_namespace)::HeapEntity::typeinfo,
                                 &(anonymous_namespace)::HeapThunk::typeinfo,0);
        if (auVar24._0_8_ == 0) {
          __assert_fail("dynamic_cast<HeapThunk *>(curr)",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                        ,0x19b,
                        "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                       );
        }
        if (pHVar5->field_0xa == '\x01') {
          if (((ulong)pHVar5[1]._vptr_HeapEntity & 0x10) != 0) {
            addIfHeapEntity(*(Heap **)&pHVar5[1].mark,(HeapEntity *)&pSVar16[-1].children,
                            auVar24._8_8_);
          }
        }
        else {
          auVar25._8_8_ = auVar24._8_8_;
          auVar25._0_8_ = pHVar5[4]._vptr_HeapEntity;
          while( true ) {
            p_Var20 = auVar25._0_8_;
            if (p_Var20 == (_Rb_tree_node_base *)(pHVar5 + 3)) break;
            addIfHeapEntity((Heap *)p_Var20[1]._M_parent,(HeapEntity *)&pSVar16[-1].children,
                            auVar25._8_8_);
            auVar25 = std::_Rb_tree_increment(p_Var20);
          }
          if (*(Heap **)&pHVar5[5].mark != (Heap *)0x0) {
            addIfHeapEntity(*(Heap **)&pHVar5[5].mark,(HeapEntity *)&pSVar16[-1].children,
                            auVar25._8_8_);
          }
        }
        break;
      case ARRAY:
        auVar24 = __dynamic_cast(pHVar5,&(anonymous_namespace)::HeapEntity::typeinfo,
                                 &(anonymous_namespace)::HeapArray::typeinfo,0);
        vec = auVar24._8_8_;
        if (auVar24._0_8_ == 0) {
          __assert_fail("dynamic_cast<HeapArray *>(curr)",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                        ,0x18b,
                        "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                       );
        }
        pp_Var7 = *(_func_int ***)&pHVar5[1].mark;
        for (pp_Var19 = pHVar5[1]._vptr_HeapEntity; pp_Var19 != pp_Var7; pp_Var19 = pp_Var19 + 1) {
          addIfHeapEntity((Heap *)*pp_Var19,(HeapEntity *)&pSVar16[-1].children,vec);
          vec = extraout_RDX;
        }
        break;
      case CLOSURE:
        auVar24 = __dynamic_cast(pHVar5,&(anonymous_namespace)::HeapEntity::typeinfo,
                                 &(anonymous_namespace)::HeapClosure::typeinfo,0);
        if (auVar24._0_8_ == 0) {
          __assert_fail("dynamic_cast<HeapClosure *>(curr)",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                        ,0x192,
                        "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                       );
        }
        uVar2 = pHVar5[2].mark;
        uVar9 = pHVar5[2].type;
        uVar13 = *(undefined6 *)&pHVar5[2].field_0xa;
        auVar22._2_6_ = uVar13;
        auVar22[1] = uVar9;
        auVar22[0] = uVar2;
        auVar22._8_8_ = auVar24._8_8_;
        while( true ) {
          p_Var20 = auVar22._0_8_;
          if (p_Var20 == (_Rb_tree_node_base *)&pHVar5[1].mark) break;
          addIfHeapEntity((Heap *)p_Var20[1]._M_parent,(HeapEntity *)&pSVar16[-1].children,
                          auVar22._8_8_);
          auVar22 = std::_Rb_tree_increment(p_Var20);
        }
        if ((Heap *)pHVar5[4]._vptr_HeapEntity != (Heap *)0x0) {
          addIfHeapEntity((Heap *)pHVar5[4]._vptr_HeapEntity,(HeapEntity *)&pSVar16[-1].children,
                          auVar22._8_8_);
        }
        break;
      case STRING:
        lVar17 = __dynamic_cast(pHVar5,&(anonymous_namespace)::HeapEntity::typeinfo,
                                &(anonymous_namespace)::HeapString::typeinfo,0);
        if (lVar17 == 0) {
          __assert_fail("dynamic_cast<HeapString *>(curr)",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                        ,0x1a9,
                        "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                       );
        }
        break;
      case SIMPLE_OBJECT:
        auVar24 = __dynamic_cast(pHVar5,&(anonymous_namespace)::HeapEntity::typeinfo,
                                 &(anonymous_namespace)::HeapSimpleObject::typeinfo,0);
        if (auVar24._0_8_ == 0) {
          __assert_fail("dynamic_cast<HeapSimpleObject *>(curr)",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                        ,0x174,
                        "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                       );
        }
        uVar1 = pHVar5[2].mark;
        uVar8 = pHVar5[2].type;
        uVar12 = *(undefined6 *)&pHVar5[2].field_0xa;
        auVar21._2_6_ = uVar12;
        auVar21[1] = uVar8;
        auVar21[0] = uVar1;
        auVar21._8_8_ = auVar24._8_8_;
        while( true ) {
          p_Var20 = auVar21._0_8_;
          if (p_Var20 == (_Rb_tree_node_base *)&pHVar5[1].mark) break;
          addIfHeapEntity((Heap *)p_Var20[1]._M_parent,(HeapEntity *)&pSVar16[-1].children,
                          auVar21._8_8_);
          auVar21 = std::_Rb_tree_increment(p_Var20);
        }
        break;
      case COMPREHENSION_OBJECT:
        auVar24 = __dynamic_cast(pHVar5,&(anonymous_namespace)::HeapEntity::typeinfo,
                                 &(anonymous_namespace)::HeapComprehensionObject::typeinfo,0);
        if (auVar24._0_8_ == 0) {
          __assert_fail("dynamic_cast<HeapComprehensionObject *>(curr)",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                        ,0x182,
                        "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                       );
        }
        uVar3 = pHVar5[2].mark;
        uVar10 = pHVar5[2].type;
        uVar14 = *(undefined6 *)&pHVar5[2].field_0xa;
        auVar23._2_6_ = uVar14;
        auVar23[1] = uVar10;
        auVar23[0] = uVar3;
        auVar23._8_8_ = auVar24._8_8_;
        while( true ) {
          p_Var20 = auVar23._0_8_;
          if (p_Var20 == (_Rb_tree_node_base *)&pHVar5[1].mark) break;
          addIfHeapEntity((Heap *)p_Var20[1]._M_parent,(HeapEntity *)&pSVar16[-1].children,
                          auVar23._8_8_);
          auVar23 = std::_Rb_tree_increment(p_Var20);
        }
        uVar4 = pHVar5[6].mark;
        uVar11 = pHVar5[6].type;
        uVar15 = *(undefined6 *)&pHVar5[6].field_0xa;
        auVar24._2_6_ = uVar15;
        auVar24[1] = uVar11;
        auVar24[0] = uVar4;
        auVar24._8_8_ = auVar23._8_8_;
        while( true ) {
          p_Var20 = auVar24._0_8_;
          if (p_Var20 == (_Rb_tree_node_base *)&pHVar5[5].mark) break;
          addIfHeapEntity((Heap *)p_Var20[1]._M_parent,(HeapEntity *)&pSVar16[-1].children,
                          auVar24._8_8_);
          auVar24 = std::_Rb_tree_increment(p_Var20);
        }
        break;
      case EXTENDED_OBJECT:
        auVar24 = __dynamic_cast(pHVar5,&(anonymous_namespace)::HeapEntity::typeinfo,
                                 &(anonymous_namespace)::HeapExtendedObject::typeinfo,0);
        if (auVar24._0_8_ == 0) {
          __assert_fail("dynamic_cast<HeapExtendedObject *>(curr)",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                        ,0x17b,
                        "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                       );
        }
        addIfHeapEntity((Heap *)pHVar5[1]._vptr_HeapEntity,(HeapEntity *)&pSVar16[-1].children,
                        auVar24._8_8_);
        addIfHeapEntity(*(Heap **)&pHVar5[1].mark,(HeapEntity *)&pSVar16[-1].children,vec_00);
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                      ,0x1ac,
                      "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)")
        ;
      }
    }
    ppHVar6 = pSVar16[-1].children.
              super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppHVar6 ==
        pSVar16[-1].children.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_58.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
      _M_finish = pSVar16 + -1;
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
      ::~vector(&pSVar16[-1].children);
    }
    else {
      local_40 = ppHVar6[-1];
      pSVar16[-1].children.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppHVar6 + -1;
      std::
      vector<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State,std::allocator<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State>>
      ::emplace_back<jsonnet::internal::(anonymous_namespace)::HeapEntity*&>
                ((vector<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State,std::allocator<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State>>
                  *)&local_58,&local_40);
    }
  } while( true );
}

Assistant:

void markFrom(HeapEntity *from)
    {
        assert(from != nullptr);
        const GarbageCollectionMark thisMark = lastMark + 1;
        struct State {
            HeapEntity *ent;
            std::vector<HeapEntity *> children;
            State(HeapEntity *ent) : ent(ent) {}
        };

        std::vector<State> stack;
        stack.emplace_back(from);

        while (stack.size() > 0) {
            size_t curr_index = stack.size() - 1;
            State &s = stack[curr_index];
            HeapEntity *curr = s.ent;
            if (curr->mark != thisMark) {
                curr->mark = thisMark;

                switch(curr->type) {
                    case HeapEntity::SIMPLE_OBJECT: {
                        assert(dynamic_cast<HeapSimpleObject *>(curr));
                        auto *obj = static_cast<HeapSimpleObject *>(curr);
                        for (auto upv : obj->upValues)
                            addIfHeapEntity(upv.second, s.children);
                        break;
                    }
                    case HeapEntity::EXTENDED_OBJECT: {
                        assert(dynamic_cast<HeapExtendedObject *>(curr));
                        auto *obj = static_cast<HeapExtendedObject *>(curr);
                        addIfHeapEntity(obj->left, s.children);
                        addIfHeapEntity(obj->right, s.children);
                        break;
                    }
                    case HeapEntity::COMPREHENSION_OBJECT: {
                        assert(dynamic_cast<HeapComprehensionObject *>(curr));
                        auto *obj = static_cast<HeapComprehensionObject *>(curr);
                        for (auto upv : obj->upValues)
                            addIfHeapEntity(upv.second, s.children);
                        for (auto upv : obj->compValues)
                            addIfHeapEntity(upv.second, s.children);
                        break;
                    }
                    case HeapEntity::ARRAY: {
                        assert(dynamic_cast<HeapArray *>(curr));
                        auto *arr = static_cast<HeapArray *>(curr);
                        for (auto el : arr->elements)
                            addIfHeapEntity(el, s.children);
                        break;
                    }
                    case HeapEntity::CLOSURE: {
                        assert(dynamic_cast<HeapClosure *>(curr));
                        auto *func = static_cast<HeapClosure *>(curr);
                        for (auto upv : func->upValues)
                            addIfHeapEntity(upv.second, s.children);
                        if (func->self)
                            addIfHeapEntity(func->self, s.children);
                        break;
                    }
                    case HeapEntity::THUNK: {
                        assert(dynamic_cast<HeapThunk *>(curr));
                        auto *thunk = static_cast<HeapThunk *>(curr);
                        if (thunk->filled) {
                            if (thunk->content.isHeap())
                                addIfHeapEntity(thunk->content.v.h, s.children);
                        } else {
                            for (auto upv : thunk->upValues)
                                addIfHeapEntity(upv.second, s.children);
                            if (thunk->self)
                                addIfHeapEntity(thunk->self, s.children);
                        }
                        break;
                    }
                    case HeapEntity::STRING:
                        assert(dynamic_cast<HeapString *>(curr));
                        break;
                    default:
                        assert(false);
                        break;
                }
            }

            if (s.children.size() > 0) {
                HeapEntity *next = s.children[s.children.size() - 1];
                s.children.pop_back();
                stack.emplace_back(next);  // CAUTION: s invalidated here
            } else {
                stack.pop_back();  // CAUTION: s invalidated here
            }
        }
    }